

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O1

_Bool trans_VRINTR_dp(DisasContext_conflict1 *s,arg_VRINTR_dp *a)

{
  uint uVar1;
  TCGContext_conflict1 *s_00;
  _Bool _Var2;
  TCGTemp *ret;
  TCGTemp *ts;
  _Bool _Var3;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  uVar1 = s->isar->mvfr0;
  if ((((uVar1 & 0xf00) == 0) || ((s->isar->mvfr2 & 0xf0) < 0x21)) ||
     ((s_00 = s->uc->tcg_ctx, (uVar1 & 0xe) == 0 && (((a->vm | a->vd) & 0x10U) != 0)))) {
    _Var3 = false;
  }
  else {
    _Var2 = full_vfp_access_check(s,false);
    _Var3 = true;
    if (_Var2) {
      ret = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_op3_aarch64(s_00,INDEX_op_ld_i64,(TCGArg)ret,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)((uint)a->vm >> 1) * 0x100 + (ulong)(a->vm & 1) * 8 + 0xc10);
      ts = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
      tcg_gen_addi_i64_aarch64
                (s_00,(TCGv_i64)((long)ts - (long)s_00),(TCGv_i64)s_00->cpu_env,0x2ec8);
      local_48 = ret;
      local_40 = ts;
      tcg_gen_callN_aarch64(s_00,helper_rintd_aarch64,ret,2,&local_48);
      tcg_gen_op3_aarch64(s_00,INDEX_op_st_i64,(TCGArg)ret,(TCGArg)(s_00->cpu_env + (long)s_00),
                          (ulong)((uint)a->vd >> 1) * 0x100 + (ulong)(a->vd & 1) * 8 + 0xc10);
      tcg_temp_free_internal_aarch64(s_00,ts);
      tcg_temp_free_internal_aarch64(s_00,ret);
    }
  }
  return _Var3;
}

Assistant:

static bool trans_VRINTR_dp(DisasContext *s, arg_VRINTR_dp *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_ptr fpst;
    TCGv_i64 tmp;

    if (!dc_isar_feature(aa32_fpdp_v2, s)) {
        return false;
    }

    if (!dc_isar_feature(aa32_vrint, s)) {
        return false;
    }

    /* UNDEF accesses to D16-D31 if they don't exist. */
    if (!dc_isar_feature(aa32_simd_r32, s) && ((a->vd | a->vm) & 0x10)) {
        return false;
    }

    if (!vfp_access_check(s)) {
        return true;
    }

    tmp = tcg_temp_new_i64(tcg_ctx);
    neon_load_reg64(tcg_ctx, tmp, a->vm);
    fpst = get_fpstatus_ptr(tcg_ctx, false);
    gen_helper_rintd(tcg_ctx, tmp, tmp, fpst);
    neon_store_reg64(tcg_ctx, tmp, a->vd);
    tcg_temp_free_ptr(tcg_ctx, fpst);
    tcg_temp_free_i64(tcg_ctx, tmp);
    return true;
}